

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_id.cc
# Opt level: O0

S2CellId S2CellId::FromFaceIJ(int face,int i,int j)

{
  unsigned_long_long uVar1;
  int mask_7;
  int mask_6;
  int mask_5;
  int mask_4;
  int mask_3;
  int mask_2;
  int mask_1;
  int mask;
  uint64 bits;
  uint64 n;
  int j_local;
  int i_local;
  int face_local;
  
  MaybeInit();
  uVar1 = absl::implicit_cast<unsigned_long_long>((long)face);
  S2CellId((S2CellId *)&i_local,
           ((ulong)(lookup_pos
                    [(long)(int)((j & 0xfU) << 2) +
                     (long)(int)((i & 0xfU) << 6) +
                     ((ulong)lookup_pos
                             [(long)(int)((j >> 4 & 0xfU) << 2) +
                              (long)(int)((i >> 4 & 0xfU) << 6) +
                              ((ulong)lookup_pos
                                      [(long)(int)((j >> 8 & 0xfU) << 2) +
                                       (long)(int)((i >> 8 & 0xfU) << 6) +
                                       ((ulong)lookup_pos
                                               [(long)(int)((j >> 0xc & 0xfU) << 2) +
                                                (long)(int)((i >> 0xc & 0xfU) << 6) +
                                                ((ulong)lookup_pos
                                                        [(long)(int)((j >> 0x10 & 0xfU) << 2) +
                                                         (long)(int)((i >> 0x10 & 0xfU) << 6) +
                                                         ((ulong)lookup_pos
                                                                 [(long)(int)((j >> 0x14 & 0xfU) <<
                                                                             2) +
                                                                  (long)(int)((i >> 0x14 & 0xfU) <<
                                                                             6) +
                                                                  ((ulong)lookup_pos
                                                                          [(long)(int)((j >> 0x18 &
                                                                                       0xfU) << 2) +
                                                                           (long)(int)((i >> 0x18 &
                                                                                       0xfU) << 6) +
                                                                           ((ulong)lookup_pos
                                                                                   [(long)(int)((j 
                                                  >> 0x1c & 0xfU) << 2) +
                                                  (long)(int)((i >> 0x1c & 0xfU) << 6) +
                                                  (long)(int)(face & 1)] & 3)] & 3)] & 3)] & 3)] & 3
                                       )] & 3)] & 3)] >> 2) |
           (ulong)(lookup_pos
                   [(long)(int)((j >> 4 & 0xfU) << 2) +
                    (long)(int)((i >> 4 & 0xfU) << 6) +
                    ((ulong)lookup_pos
                            [(long)(int)((j >> 8 & 0xfU) << 2) +
                             (long)(int)((i >> 8 & 0xfU) << 6) +
                             ((ulong)lookup_pos
                                     [(long)(int)((j >> 0xc & 0xfU) << 2) +
                                      (long)(int)((i >> 0xc & 0xfU) << 6) +
                                      ((ulong)lookup_pos
                                              [(long)(int)((j >> 0x10 & 0xfU) << 2) +
                                               (long)(int)((i >> 0x10 & 0xfU) << 6) +
                                               ((ulong)lookup_pos
                                                       [(long)(int)((j >> 0x14 & 0xfU) << 2) +
                                                        (long)(int)((i >> 0x14 & 0xfU) << 6) +
                                                        ((ulong)lookup_pos
                                                                [(long)(int)((j >> 0x18 & 0xfU) << 2
                                                                            ) +
                                                                 (long)(int)((i >> 0x18 & 0xfU) << 6
                                                                            ) +
                                                                 ((ulong)lookup_pos
                                                                         [(long)(int)((j >> 0x1c &
                                                                                      0xfU) << 2) +
                                                                          (long)(int)((i >> 0x1c &
                                                                                      0xfU) << 6) +
                                                                          (long)(int)(face & 1)] & 3
                                                                 )] & 3)] & 3)] & 3)] & 3)] & 3)] >>
                  2) << 8 |
           (ulong)(lookup_pos
                   [(long)(int)((j >> 8 & 0xfU) << 2) +
                    (long)(int)((i >> 8 & 0xfU) << 6) +
                    ((ulong)lookup_pos
                            [(long)(int)((j >> 0xc & 0xfU) << 2) +
                             (long)(int)((i >> 0xc & 0xfU) << 6) +
                             ((ulong)lookup_pos
                                     [(long)(int)((j >> 0x10 & 0xfU) << 2) +
                                      (long)(int)((i >> 0x10 & 0xfU) << 6) +
                                      ((ulong)lookup_pos
                                              [(long)(int)((j >> 0x14 & 0xfU) << 2) +
                                               (long)(int)((i >> 0x14 & 0xfU) << 6) +
                                               ((ulong)lookup_pos
                                                       [(long)(int)((j >> 0x18 & 0xfU) << 2) +
                                                        (long)(int)((i >> 0x18 & 0xfU) << 6) +
                                                        ((ulong)lookup_pos
                                                                [(long)(int)((j >> 0x1c & 0xfU) << 2
                                                                            ) +
                                                                 (long)(int)((i >> 0x1c & 0xfU) << 6
                                                                            ) +
                                                                 (long)(int)(face & 1)] & 3)] & 3)]
                                      & 3)] & 3)] & 3)] >> 2) << 0x10 |
           (ulong)(lookup_pos
                   [(long)(int)((j >> 0xc & 0xfU) << 2) +
                    (long)(int)((i >> 0xc & 0xfU) << 6) +
                    ((ulong)lookup_pos
                            [(long)(int)((j >> 0x10 & 0xfU) << 2) +
                             (long)(int)((i >> 0x10 & 0xfU) << 6) +
                             ((ulong)lookup_pos
                                     [(long)(int)((j >> 0x14 & 0xfU) << 2) +
                                      (long)(int)((i >> 0x14 & 0xfU) << 6) +
                                      ((ulong)lookup_pos
                                              [(long)(int)((j >> 0x18 & 0xfU) << 2) +
                                               (long)(int)((i >> 0x18 & 0xfU) << 6) +
                                               ((ulong)lookup_pos
                                                       [(long)(int)((j >> 0x1c & 0xfU) << 2) +
                                                        (long)(int)((i >> 0x1c & 0xfU) << 6) +
                                                        (long)(int)(face & 1)] & 3)] & 3)] & 3)] & 3
                    )] >> 2) << 0x18 |
           (ulong)(lookup_pos
                   [(long)(int)((j >> 0x10 & 0xfU) << 2) +
                    (long)(int)((i >> 0x10 & 0xfU) << 6) +
                    ((ulong)lookup_pos
                            [(long)(int)((j >> 0x14 & 0xfU) << 2) +
                             (long)(int)((i >> 0x14 & 0xfU) << 6) +
                             ((ulong)lookup_pos
                                     [(long)(int)((j >> 0x18 & 0xfU) << 2) +
                                      (long)(int)((i >> 0x18 & 0xfU) << 6) +
                                      ((ulong)lookup_pos
                                              [(long)(int)((j >> 0x1c & 0xfU) << 2) +
                                               (long)(int)((i >> 0x1c & 0xfU) << 6) +
                                               (long)(int)(face & 1)] & 3)] & 3)] & 3)] >> 2) <<
           0x20 | (ulong)(lookup_pos
                          [(long)(int)((j >> 0x14 & 0xfU) << 2) +
                           (long)(int)((i >> 0x14 & 0xfU) << 6) +
                           ((ulong)lookup_pos
                                   [(long)(int)((j >> 0x18 & 0xfU) << 2) +
                                    (long)(int)((i >> 0x18 & 0xfU) << 6) +
                                    ((ulong)lookup_pos
                                            [(long)(int)((j >> 0x1c & 0xfU) << 2) +
                                             (long)(int)((i >> 0x1c & 0xfU) << 6) +
                                             (long)(int)(face & 1)] & 3)] & 3)] >> 2) << 0x28 |
                  (ulong)(lookup_pos
                          [(long)(int)((j >> 0x18 & 0xfU) << 2) +
                           (long)(int)((i >> 0x18 & 0xfU) << 6) +
                           ((ulong)lookup_pos
                                   [(long)(int)((j >> 0x1c & 0xfU) << 2) +
                                    (long)(int)((i >> 0x1c & 0xfU) << 6) + (long)(int)(face & 1)] &
                           3)] >> 2) << 0x30 |
                  (ulong)(lookup_pos
                          [(long)(int)((j >> 0x1c & 0xfU) << 2) +
                           (long)(int)((i >> 0x1c & 0xfU) << 6) + (long)(int)(face & 1)] >> 2) <<
                  0x38 | uVar1 << 0x3c) * 2 + 1);
  return (S2CellId)_i_local;
}

Assistant:

S2CellId S2CellId::FromFaceIJ(int face, int i, int j) {
  // Initialization if not done yet
  MaybeInit();

  // Optimization notes:
  //  - Non-overlapping bit fields can be combined with either "+" or "|".
  //    Generally "+" seems to produce better code, but not always.

  // Note that this value gets shifted one bit to the left at the end
  // of the function.
  uint64 n = absl::implicit_cast<uint64>(face) << (kPosBits - 1);

  // Alternating faces have opposite Hilbert curve orientations; this
  // is necessary in order for all faces to have a right-handed
  // coordinate system.
  uint64 bits = (face & kSwapMask);

  // Each iteration maps 4 bits of "i" and "j" into 8 bits of the Hilbert
  // curve position.  The lookup table transforms a 10-bit key of the form
  // "iiiijjjjoo" to a 10-bit value of the form "ppppppppoo", where the
  // letters [ijpo] denote bits of "i", "j", Hilbert curve position, and
  // Hilbert curve orientation respectively.
#define GET_BITS(k) do { \
    const int mask = (1 << kLookupBits) - 1; \
    bits += ((i >> (k * kLookupBits)) & mask) << (kLookupBits + 2); \
    bits += ((j >> (k * kLookupBits)) & mask) << 2; \
    bits = lookup_pos[bits]; \
    n |= (bits >> 2) << (k * 2 * kLookupBits); \
    bits &= (kSwapMask | kInvertMask); \
  } while (0)

  GET_BITS(7);
  GET_BITS(6);
  GET_BITS(5);
  GET_BITS(4);
  GET_BITS(3);
  GET_BITS(2);
  GET_BITS(1);
  GET_BITS(0);
#undef GET_BITS

  return S2CellId(n * 2 + 1);
}